

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O2

int FFSBitfieldTest(FFSMetadataInfoStruct *MBase,int Bit)

{
  size_t *__ptr;
  ulong uVar1;
  
  uVar1 = (ulong)(Bit >> 6);
  __ptr = MBase->BitField;
  if (MBase->BitFieldCount <= uVar1) {
    __ptr = (size_t *)realloc(__ptr,uVar1 * 8 + 8);
    MBase->BitField = __ptr;
    memset(__ptr + MBase->BitFieldCount,0,(uVar1 - MBase->BitFieldCount) * 8 + 8);
    MBase->BitFieldCount = uVar1 + 1;
  }
  return (int)((__ptr[uVar1] >> ((ulong)(uint)Bit & 0x3f) & 1) != 0);
}

Assistant:

static int FFSBitfieldTest(struct FFSMetadataInfoStruct *MBase, int Bit)
{
    int Element = Bit / (sizeof(size_t) * 8);
    int ElementBit = Bit % (sizeof(size_t) * 8);
    if (Element >= MBase->BitFieldCount)
    {
        MBase->BitField = realloc(MBase->BitField, sizeof(size_t) * (Element + 1));
        memset(MBase->BitField + MBase->BitFieldCount, 0,
               (Element - MBase->BitFieldCount + 1) * sizeof(size_t));
        MBase->BitFieldCount = Element + 1;
    }
    return ((MBase->BitField[Element] & ((size_t)1 << ElementBit)) == ((size_t)1 << ElementBit));
}